

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

void __thiscall ON_FixedSizePool::ReturnElement(ON_FixedSizePool *this,void *p)

{
  void *p_local;
  ON_FixedSizePool *this_local;
  
  if (p != (void *)0x0) {
    if (this->m_active_element_count == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                 ,0x214,"","ON_FixedSizePool::ReturnElement - no active elements exist.");
    }
    else {
      this->m_active_element_count = this->m_active_element_count - 1;
      *(void **)p = this->m_al_element_stack;
      this->m_al_element_stack = p;
    }
  }
  return;
}

Assistant:

void ON_FixedSizePool::ReturnElement(void* p)
{
  if ( p )
  {
    if ( m_active_element_count <= 0 )
    {
      // If you get this error, something is seriously wrong.
      // You may be returning the same element multiple times or
      // you may be returning pointers that are not from this pool.
      // In any case, you're probably going to be crashing sometime soon.
      ON_ERROR("ON_FixedSizePool::ReturnElement - no active elements exist.");
    }
    else
    {
      m_active_element_count--;
      *((void**)p) = m_al_element_stack;
      m_al_element_stack = p;
    }
  }
}